

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-sendmsg.c
# Opt level: O0

void set_nonblocking(uv_os_sock_t sock)

{
  uint uVar1;
  int iVar2;
  int flags;
  int r;
  uv_os_sock_t sock_local;
  
  uVar1 = fcntl64(sock,3,0);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-sendmsg.c"
            ,0x33,"flags >= 0");
    abort();
  }
  iVar2 = fcntl64(sock,4,uVar1 | 0x800);
  if (iVar2 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-sendmsg.c"
            ,0x35,"r >= 0");
    abort();
  }
  return;
}

Assistant:

static void set_nonblocking(uv_os_sock_t sock) {
  int r;
#ifdef _WIN32
  unsigned long on = 1;
  r = ioctlsocket(sock, FIONBIO, &on);
  ASSERT(r == 0);
#else
  int flags = fcntl(sock, F_GETFL, 0);
  ASSERT(flags >= 0);
  r = fcntl(sock, F_SETFL, flags | O_NONBLOCK);
  ASSERT(r >= 0);
#endif
}